

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall
leveldb::VersionSet::Builder::MaybeAddFile(Builder *this,Version *v,int level,FileMetaData *f)

{
  pointer *pppFVar1;
  pointer ppFVar2;
  FileMetaData *pFVar3;
  size_type sVar4;
  iterator __position;
  int iVar5;
  size_type sVar6;
  InternalKeyComparator *pIVar7;
  long in_FS_OFFSET;
  FileMetaData *local_48;
  pointer local_40;
  size_type local_38;
  pointer local_30;
  size_type local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = f;
  sVar6 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::count
                    (&this->levels_[level].deleted_files,&f->number);
  if (sVar6 == 0) {
    if ((0 < level) &&
       (ppFVar2 = v->files_[level].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
       *(pointer *)(v->files_ + level) != ppFVar2)) {
      pFVar3 = ppFVar2[-1];
      sVar4 = (pFVar3->largest).rep_._M_string_length;
      if (sVar4 == 0) {
LAB_00d1f6a3:
        __assert_fail("!rep_.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.h"
                      ,0x96,"Slice leveldb::InternalKey::Encode() const");
      }
      local_30 = (pFVar3->largest).rep_._M_dataplus._M_p;
      local_38 = (local_48->smallest).rep_._M_string_length;
      local_28 = sVar4;
      if (local_38 == 0) goto LAB_00d1f6a3;
      pIVar7 = &this->vset_->icmp_;
      local_40 = (local_48->smallest).rep_._M_dataplus._M_p;
      iVar5 = (*(pIVar7->super_Comparator)._vptr_Comparator[2])(pIVar7,&local_30);
      if (-1 < iVar5) {
        __assert_fail("vset_->icmp_.Compare((*files)[files->size() - 1]->largest, f->smallest) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                      ,0x2d6,
                      "void leveldb::VersionSet::Builder::MaybeAddFile(Version *, int, FileMetaData *)"
                     );
      }
    }
    local_48->refs = local_48->refs + 1;
    __position._M_current =
         v->files_[level].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        v->files_[level].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
      _M_realloc_insert<leveldb::FileMetaData*const&>
                ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                 (v->files_ + level),__position,&local_48);
    }
    else {
      *__position._M_current = local_48;
      pppFVar1 = &v->files_[level].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MaybeAddFile(Version* v, int level, FileMetaData* f) {
    if (levels_[level].deleted_files.count(f->number) > 0) {
      // File is deleted: do nothing
    } else {
      std::vector<FileMetaData*>* files = &v->files_[level];
      if (level > 0 && !files->empty()) {
        // Must not overlap
        assert(vset_->icmp_.Compare((*files)[files->size() - 1]->largest,
                                    f->smallest) < 0);
      }
      f->refs++;
      files->push_back(f);
    }
  }